

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  uint8 *puVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar6;
  int iVar7;
  size_t sVar8;
  LogFinisher local_69;
  LogMessage local_68;
  ulong byte_size_before_serialization;
  
  iVar3 = (*this->_vptr_MessageLite[0xc])();
  byte_size_before_serialization = CONCAT44(extraout_var,iVar3);
  if ((byte_size_before_serialization & 0xffffffff80000000) == 0) {
    iVar7 = output->buffer_size_;
    if (iVar3 <= iVar7) {
      puVar2 = output->buffer_;
      output->buffer_ = puVar2 + byte_size_before_serialization;
      output->buffer_size_ = iVar7 - iVar3;
      iVar7 = iVar7 - iVar3;
      if (puVar2 != (uint8 *)0x0) {
        uVar5 = io::CodedOutputStream::default_serialization_deterministic_;
        if (output->serialization_deterministic_is_overridden_ != false) {
          uVar5 = (ulong)output->serialization_deterministic_override_;
        }
        iVar3 = (*this->_vptr_MessageLite[0x10])(this,(ulong)(uVar5 != 0),puVar2);
        sVar8 = CONCAT44(extraout_var_01,iVar3) - (long)puVar2;
        if (sVar8 == byte_size_before_serialization) {
          return true;
        }
        iVar3 = (*this->_vptr_MessageLite[0xc])(this);
        anon_unknown_12::ByteSizeConsistencyError
                  (byte_size_before_serialization,CONCAT44(extraout_var_02,iVar3),sVar8,this);
        return true;
      }
    }
    iVar3 = output->total_bytes_;
    (*this->_vptr_MessageLite[0xd])(this,output);
    bVar1 = output->had_error_;
    if ((bVar1 == false) &&
       (sVar8 = (size_t)((iVar7 + output->total_bytes_) - (iVar3 + output->buffer_size_)),
       byte_size_before_serialization != sVar8)) {
      iVar3 = (*this->_vptr_MessageLite[0xc])(this);
      anon_unknown_12::ByteSizeConsistencyError
                (byte_size_before_serialization,CONCAT44(extraout_var_00,iVar3),sVar8,this);
    }
    bVar6 = bVar1 ^ 1;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0xfc);
    pLVar4 = internal::LogMessage::operator<<(&local_68,"Exceeded maximum protobuf size of 2GB: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,byte_size_before_serialization);
    internal::LogFinisher::operator=(&local_69,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
    bVar6 = 0;
  }
  return (bool)bVar6;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8* buffer = output->GetDirectBufferForNBytesAndAdvance(size);
  if (buffer != NULL) {
    uint8* end = InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), buffer);
    if (end - buffer != size) {
      ByteSizeConsistencyError(size, ByteSizeLong(), end - buffer, *this);
    }
    return true;
  } else {
    int original_byte_count = output->ByteCount();
    SerializeWithCachedSizes(output);
    if (output->HadError()) {
      return false;
    }
    int final_byte_count = output->ByteCount();

    if (final_byte_count - original_byte_count != size) {
      ByteSizeConsistencyError(size, ByteSizeLong(),
                               final_byte_count - original_byte_count, *this);
    }

    return true;
  }
}